

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_0::TestCase63::run(TestCase63 *this)

{
  long this_00;
  ArrayPtr<const_kj::StringPtr> importPath_00;
  ArrayPtr<const_kj::StringPtr> importPath_01;
  ArrayPtr<const_kj::StringPtr> importPath_02;
  ArrayPtr<const_kj::StringPtr> importPath_03;
  ArrayPtr<const_kj::StringPtr> importPath_04;
  Field field;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  StructSchema SVar1;
  SegmentReader *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint64_t uVar7;
  Schema SVar8;
  Schema SVar9;
  CapTableReader *pCVar10;
  WirePointer *pWVar11;
  SegmentReader *pSVar12;
  bool bVar13;
  Reader RVar14;
  StringPtr content;
  StringPtr content_00;
  StringPtr content_01;
  StringPtr content_02;
  StringPtr content_03;
  StringPtr content_04;
  StringPtr diskPath;
  StringPtr diskPath_00;
  StringPtr diskPath_01;
  StringPtr diskPath_02;
  StringPtr diskPath_03;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr displayName;
  StringPtr nestedName;
  StringPtr displayName_00;
  StringPtr nestedName_00;
  StringPtr displayName_01;
  StringPtr nestedName_01;
  StringPtr displayName_02;
  StringPtr nestedName_02;
  StringPtr displayName_03;
  Fault f;
  ParsedSchema bazSchema;
  StructSchema graultStruct;
  StructSchema corgeStruct;
  StructSchema bazStruct;
  ParsedSchema graultSchema;
  ParsedSchema corgeSchema;
  ParsedSchema barStruct;
  ParsedSchema wrongGraultSchema;
  SchemaParser parser;
  FieldList barFields;
  Reader barProto;
  FakeFileReader reader;
  ParsedSchema barSchema;
  StringPtr importPath [3];
  ParsedSchema local_460;
  SegmentReader *local_450;
  int local_448;
  undefined4 uStack_444;
  uint local_440;
  int local_438;
  undefined4 uStack_434;
  StructPointerCount local_42c;
  int local_428;
  uint uVar15;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffbfc;
  uint in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc04 [12];
  Schema in_stack_fffffffffffffc10;
  Schema in_stack_fffffffffffffc18;
  Schema local_3e0;
  ArrayPtr<const_char> local_3d8;
  ArrayPtr<const_char> local_3c8;
  ParsedSchema local_3b8;
  ArrayPtr<const_char> local_3a8;
  SchemaParser local_398;
  FieldList local_380;
  Reader local_348;
  StringPtr *local_318;
  undefined8 uStack_310;
  StringPtr *local_308;
  undefined8 uStack_300;
  StringPtr *local_2f8;
  undefined8 uStack_2f0;
  StringPtr *local_2e8;
  undefined8 uStack_2e0;
  StringPtr *local_2d8;
  undefined8 uStack_2d0;
  FakeFileReader local_2c8;
  ArrayPtr<const_char> local_288;
  ParsedSchema local_278;
  Schema local_268;
  undefined4 uStack_260;
  StructReader local_258;
  Schema local_228;
  undefined4 uStack_220;
  StructReader local_218;
  Schema local_1e8;
  undefined4 uStack_1e0;
  StructReader local_1d8;
  Schema local_1a8;
  undefined4 uStack_1a0;
  StructReader local_198;
  Schema local_168;
  undefined4 uStack_160;
  StructReader local_158;
  Schema local_128;
  undefined4 uStack_120;
  StructReader local_118;
  Schema local_e8;
  undefined4 uStack_e0;
  StructReader local_d8;
  Schema local_a8;
  undefined4 uStack_a0;
  StructReader local_98;
  StringPtr local_68;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  
  FakeFileReader::FakeFileReader(&local_2c8);
  SchemaParser::SchemaParser(&local_398);
  SchemaParser::setDiskFilesystem(&local_398,&local_2c8.super_Filesystem);
  content.content.size_ = 0xce;
  content.content.ptr =
       "@0x8123456789abcdef;\nstruct Bar {\n  baz @0: import \"baz.capnp\".Baz;\n  corge @1: import \"../qux/corge.capnp\".Corge;\n  grault @2: import \"/grault.capnp\".Grault;\n  garply @3: import \"/garply.capnp\".Garply;\n}\n"
  ;
  name.content.size_ = 0x12;
  name.content.ptr = "src/foo/bar.capnp";
  FakeFileReader::add(&local_2c8,name,content);
  content_00.content.size_ = 0x24;
  content_00.content.ptr = "@0x823456789abcdef1;\nstruct Baz {}\n";
  name_00.content.size_ = 0x12;
  name_00.content.ptr = "src/foo/baz.capnp";
  FakeFileReader::add(&local_2c8,name_00,content_00);
  content_01.content.size_ = 0x26;
  content_01.content.ptr = "@0x83456789abcdef12;\nstruct Corge {}\n";
  name_01.content.size_ = 0x14;
  name_01.content.ptr = "src/qux/corge.capnp";
  FakeFileReader::add(&local_2c8,name_01,content_01);
  content_02.content.size_ = 0x27;
  content_02.content.ptr = "@0x8456789abcdef123;\nstruct Grault {}\n";
  name_02.content.size_ = 0x1a;
  name_02.content.ptr = "/usr/include/grault.capnp";
  FakeFileReader::add(&local_2c8,name_02,content_02);
  content_03.content.size_ = 0x2c;
  content_03.content.ptr = "@0x8000000000000001;\nstruct WrongGrault {}\n";
  name_03.content.size_ = 0x1a;
  name_03.content.ptr = "/opt/include/grault.capnp";
  FakeFileReader::add(&local_2c8,name_03,content_03);
  content_04.content.size_ = 0x27;
  content_04.content.ptr = "@0x856789abcdef1234;\nstruct Garply {}\n";
  name_04.content.size_ = 0x20;
  name_04.content.ptr = "/usr/local/include/garply.capnp";
  FakeFileReader::add(&local_2c8,name_04,content_04);
  local_68.content.ptr = "/usr/include";
  local_68.content.size_ = 0xd;
  local_58 = "/usr/local/include";
  local_50 = 0x13;
  local_48 = "/opt/include";
  local_40 = 0xd;
  uStack_2d0 = 3;
  importPath_00.size_ = 3;
  importPath_00.ptr = &local_68;
  diskPath.content.size_ = 0x12;
  diskPath.content.ptr = "src/foo/bar.capnp";
  displayName.content.size_ = 0x10;
  displayName.content.ptr = "foo2/bar2.capnp";
  local_2d8 = &local_68;
  local_278 = SchemaParser::parseDiskFile(&local_398,displayName,diskPath,importPath_00);
  Schema::getProto(&local_348,&local_278.super_Schema);
  bVar13 = true;
  if (0x3f < local_348._reader.dataSize) {
    bVar13 = *local_348._reader.data != -0x7edcba9876543211;
  }
  if ((bVar13) && (kj::_::Debug::minSeverity < 3)) {
    local_460.super_Schema.raw = (RawBrandedSchema *)0x8123456789abcdef;
    if (local_348._reader.dataSize < 0x40) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = *local_348._reader.data;
    }
    local_380.parent.super_Schema.raw = (Schema)(Schema)pcVar6;
    kj::_::Debug::log<char_const(&)[63],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,100,ERROR,
               "\"failed: expected \" \"(0x8123456789abcdefull) == (barProto.getId())\", 0x8123456789abcdefull, barProto.getId()"
               ,(char (*) [63])"failed: expected (0x8123456789abcdefull) == (barProto.getId())",
               (unsigned_long_long *)&local_460,(unsigned_long *)&local_380);
  }
  local_460.parser = (SchemaParser *)local_348._reader.capTable;
  local_450 = (SegmentReader *)local_348._reader.pointers;
  local_460.super_Schema.raw = (RawBrandedSchema *)local_348._reader.segment;
  local_448 = local_348._reader.nestingLimit;
  if (local_348._reader.pointerCount == 0) {
    local_460.parser = (SchemaParser *)(CapTableReader *)0x0;
    local_450 = (SegmentReader *)0x0;
    local_460.super_Schema.raw = (RawBrandedSchema *)0x0;
    local_448 = 0x7fffffff;
  }
  RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_460,(void *)0x0,0);
  pSVar12 = local_450;
  iVar5 = local_448;
  pSVar2 = (SegmentReader *)local_348._reader.pointers;
  iVar4 = local_348._reader.nestingLimit;
  if (((RVar14.super_StringPtr.content.size_ != 0x10) ||
      (iVar3 = bcmp(RVar14.super_StringPtr.content.ptr,"foo2/bar2.capnp",0xf), pSVar12 = local_450,
      iVar5 = local_448, pSVar2 = (SegmentReader *)local_348._reader.pointers,
      iVar4 = local_348._reader.nestingLimit, iVar3 != 0)) &&
     (local_448 = iVar4, local_450 = pSVar2, kj::_::Debug::minSeverity < 3)) {
    if (local_348._reader.pointerCount == 0) {
      local_448 = 0x7fffffff;
      local_348._reader.capTable = (CapTableReader *)0x0;
      local_450 = (SegmentReader *)0x0;
      local_348._reader.segment = (SegmentReader *)0x0;
    }
    local_460.super_Schema.raw = (RawBrandedSchema *)local_348._reader.segment;
    local_460.parser = (SchemaParser *)local_348._reader.capTable;
    local_380._0_16_ =
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_460,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"(\\\"foo2/bar2.capnp\\\") == (barProto.getDisplayName())\", \"foo2/bar2.capnp\", barProto.getDisplayName()"
               ,(char (*) [68])
                "failed: expected (\"foo2/bar2.capnp\") == (barProto.getDisplayName())",
               (char (*) [16])"foo2/bar2.capnp",(Reader *)&local_380);
    pSVar12 = local_450;
    iVar5 = local_448;
  }
  local_448 = iVar5;
  local_450 = pSVar12;
  nestedName.content.size_ = 4;
  nestedName.content.ptr = "Bar";
  local_3b8 = ParsedSchema::getNested(&local_278,nestedName);
  local_460.super_Schema.raw = (RawBrandedSchema *)Schema::asStruct(&local_3b8.super_Schema);
  StructSchema::getFields(&local_380,(StructSchema *)&local_460);
  if (local_380.list.reader.elementCount == 4) {
    this_00 = (long)&local_380 + 8;
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,0);
    local_460.parser._0_4_ = 0;
    local_460.super_Schema = SVar1.super_Schema.raw;
    if (local_42c == 0) {
      iVar5 = 0x7fffffff;
      pCVar10 = (CapTableReader *)0x0;
      pWVar11 = (WirePointer *)0x0;
      pSVar12 = (SegmentReader *)0x0;
    }
    else {
      pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
      pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
      pSVar12 = local_450;
      iVar5 = local_428;
    }
    uVar15 = (uint)pSVar12;
    uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 4) ||
        (iVar4 = bcmp(RVar14.super_StringPtr.content.ptr,"baz",3), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,0);
      local_460.parser._0_4_ = 0;
      local_460.super_Schema = SVar1.super_Schema.raw;
      if (local_42c == 0) {
        iVar5 = 0x7fffffff;
        pCVar10 = (CapTableReader *)0x0;
        pWVar11 = (WirePointer *)0x0;
        pSVar12 = (SegmentReader *)0x0;
      }
      else {
        pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
        pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
        pSVar12 = local_450;
        iVar5 = local_428;
      }
      uVar15 = (uint)pSVar12;
      uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
      RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      in_stack_fffffffffffffc00 = (uint)RVar14.super_StringPtr.content.ptr;
      in_stack_fffffffffffffc04 = RVar14.super_StringPtr.content._4_12_;
      kj::_::Debug::log<char_const(&)[64],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (barFields[0].getProto().getName())\", \"baz\", barFields[0].getProto().getName()"
                 ,(char (*) [64])"failed: expected (\"baz\") == (barFields[0].getProto().getName())"
                 ,(char (*) [4])0x51a1ff,(Reader *)&stack0xfffffffffffffc00);
    }
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_98,(ListReader *)this_00,0);
    local_a8 = SVar1.super_Schema.raw;
    uStack_a0 = 0;
    field.parent.super_Schema.raw._4_4_ = uVar16;
    field.parent.super_Schema.raw._0_4_ = uVar15;
    field._8_8_ = pCVar10;
    field.proto._reader.segment = (SegmentReader *)pWVar11;
    field.proto._reader.capTable._0_4_ = iVar5;
    field.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
    field.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    uVar7 = getFieldTypeFileId(field);
    if ((uVar7 != 0x823456789abcdef1) && (kj::_::Debug::minSeverity < 3)) {
      local_460.super_Schema.raw = (RawBrandedSchema *)0x823456789abcdef1;
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement(&local_d8,(ListReader *)this_00,0);
      local_e8 = SVar1.super_Schema.raw;
      uStack_e0 = 0;
      field_00.parent.super_Schema.raw._4_4_ = uVar16;
      field_00.parent.super_Schema.raw._0_4_ = uVar15;
      field_00._8_8_ = pCVar10;
      field_00.proto._reader.segment = (SegmentReader *)pWVar11;
      field_00.proto._reader.capTable._0_4_ = iVar5;
      field_00.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
      field_00.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
      field_00.proto._reader._20_12_ = in_stack_fffffffffffffc04;
      field_00.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
      field_00.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
      getFieldTypeFileId(field_00);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"(0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))\", 0x823456789abcdef1ull, getFieldTypeFileId(barFields[0])"
                 ,(char (*) [79])
                  "failed: expected (0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))",
                 (unsigned_long_long *)&local_460,(unsigned_long *)&stack0xfffffffffffffbe0);
    }
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,1);
    local_460.parser._0_4_ = 1;
    local_460.super_Schema = SVar1.super_Schema.raw;
    if (local_42c == 0) {
      iVar5 = 0x7fffffff;
      pCVar10 = (CapTableReader *)0x0;
      pWVar11 = (WirePointer *)0x0;
      pSVar12 = (SegmentReader *)0x0;
    }
    else {
      pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
      pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
      pSVar12 = local_450;
      iVar5 = local_428;
    }
    uVar15 = (uint)pSVar12;
    uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 6) ||
        (iVar4 = bcmp(RVar14.super_StringPtr.content.ptr,"corge",5), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,1);
      local_460.parser._0_4_ = 1;
      local_460.super_Schema = SVar1.super_Schema.raw;
      if (local_42c == 0) {
        iVar5 = 0x7fffffff;
        pCVar10 = (CapTableReader *)0x0;
        pWVar11 = (WirePointer *)0x0;
        pSVar12 = (SegmentReader *)0x0;
      }
      else {
        pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
        pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
        pSVar12 = local_450;
        iVar5 = local_428;
      }
      uVar15 = (uint)pSVar12;
      uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
      RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      in_stack_fffffffffffffc00 = (uint)RVar14.super_StringPtr.content.ptr;
      in_stack_fffffffffffffc04 = RVar14.super_StringPtr.content._4_12_;
      kj::_::Debug::log<char_const(&)[66],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6c,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (barFields[1].getProto().getName())\", \"corge\", barFields[1].getProto().getName()"
                 ,(char (*) [66])
                  "failed: expected (\"corge\") == (barFields[1].getProto().getName())",
                 (char (*) [6])"corge",(Reader *)&stack0xfffffffffffffc00);
    }
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_118,(ListReader *)this_00,1);
    local_128 = SVar1.super_Schema.raw;
    uStack_120 = 1;
    field_01.parent.super_Schema.raw._4_4_ = uVar16;
    field_01.parent.super_Schema.raw._0_4_ = uVar15;
    field_01._8_8_ = pCVar10;
    field_01.proto._reader.segment = (SegmentReader *)pWVar11;
    field_01.proto._reader.capTable._0_4_ = iVar5;
    field_01.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
    field_01.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field_01.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field_01.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field_01.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    uVar7 = getFieldTypeFileId(field_01);
    if ((uVar7 != 0x83456789abcdef12) && (kj::_::Debug::minSeverity < 3)) {
      local_460.super_Schema.raw = (RawBrandedSchema *)0x83456789abcdef12;
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement(&local_158,(ListReader *)this_00,1);
      local_168 = SVar1.super_Schema.raw;
      uStack_160 = 1;
      field_02.parent.super_Schema.raw._4_4_ = uVar16;
      field_02.parent.super_Schema.raw._0_4_ = uVar15;
      field_02._8_8_ = pCVar10;
      field_02.proto._reader.segment = (SegmentReader *)pWVar11;
      field_02.proto._reader.capTable._0_4_ = iVar5;
      field_02.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
      field_02.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
      field_02.proto._reader._20_12_ = in_stack_fffffffffffffc04;
      field_02.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
      field_02.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
      getFieldTypeFileId(field_02);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"(0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))\", 0x83456789abcdef12ull, getFieldTypeFileId(barFields[1])"
                 ,(char (*) [79])
                  "failed: expected (0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))",
                 (unsigned_long_long *)&local_460,(unsigned_long *)&stack0xfffffffffffffbe0);
    }
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,2);
    local_460.parser._0_4_ = 2;
    local_460.super_Schema = SVar1.super_Schema.raw;
    if (local_42c == 0) {
      iVar5 = 0x7fffffff;
      pCVar10 = (CapTableReader *)0x0;
      pWVar11 = (WirePointer *)0x0;
      pSVar12 = (SegmentReader *)0x0;
    }
    else {
      pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
      pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
      pSVar12 = local_450;
      iVar5 = local_428;
    }
    uVar15 = (uint)pSVar12;
    uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 7) ||
        (iVar4 = bcmp(RVar14.super_StringPtr.content.ptr,"grault",6), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,2);
      local_460.parser._0_4_ = 2;
      local_460.super_Schema = SVar1.super_Schema.raw;
      if (local_42c == 0) {
        iVar5 = 0x7fffffff;
        pCVar10 = (CapTableReader *)0x0;
        pWVar11 = (WirePointer *)0x0;
        pSVar12 = (SegmentReader *)0x0;
      }
      else {
        pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
        pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
        pSVar12 = local_450;
        iVar5 = local_428;
      }
      uVar15 = (uint)pSVar12;
      uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
      RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      in_stack_fffffffffffffc00 = (uint)RVar14.super_StringPtr.content.ptr;
      in_stack_fffffffffffffc04 = RVar14.super_StringPtr.content._4_12_;
      kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6e,ERROR,
                 "\"failed: expected \" \"(\\\"grault\\\") == (barFields[2].getProto().getName())\", \"grault\", barFields[2].getProto().getName()"
                 ,(char (*) [67])
                  "failed: expected (\"grault\") == (barFields[2].getProto().getName())",
                 (char (*) [7])"grault",(Reader *)&stack0xfffffffffffffc00);
    }
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_198,(ListReader *)this_00,2);
    local_1a8 = SVar1.super_Schema.raw;
    uStack_1a0 = 2;
    field_03.parent.super_Schema.raw._4_4_ = uVar16;
    field_03.parent.super_Schema.raw._0_4_ = uVar15;
    field_03._8_8_ = pCVar10;
    field_03.proto._reader.segment = (SegmentReader *)pWVar11;
    field_03.proto._reader.capTable._0_4_ = iVar5;
    field_03.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
    field_03.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field_03.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field_03.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field_03.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    uVar7 = getFieldTypeFileId(field_03);
    if ((uVar7 != 0x8456789abcdef123) && (kj::_::Debug::minSeverity < 3)) {
      local_460.super_Schema.raw = (RawBrandedSchema *)0x8456789abcdef123;
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement(&local_1d8,(ListReader *)this_00,2);
      local_1e8 = SVar1.super_Schema.raw;
      uStack_1e0 = 2;
      field_04.parent.super_Schema.raw._4_4_ = uVar16;
      field_04.parent.super_Schema.raw._0_4_ = uVar15;
      field_04._8_8_ = pCVar10;
      field_04.proto._reader.segment = (SegmentReader *)pWVar11;
      field_04.proto._reader.capTable._0_4_ = iVar5;
      field_04.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
      field_04.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
      field_04.proto._reader._20_12_ = in_stack_fffffffffffffc04;
      field_04.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
      field_04.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
      getFieldTypeFileId(field_04);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x6f,ERROR,
                 "\"failed: expected \" \"(0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))\", 0x8456789abcdef123ull, getFieldTypeFileId(barFields[2])"
                 ,(char (*) [79])
                  "failed: expected (0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))",
                 (unsigned_long_long *)&local_460,(unsigned_long *)&stack0xfffffffffffffbe0);
    }
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,3);
    local_460.parser._0_4_ = 3;
    local_460.super_Schema = SVar1.super_Schema.raw;
    if (local_42c == 0) {
      iVar5 = 0x7fffffff;
      pCVar10 = (CapTableReader *)0x0;
      pWVar11 = (WirePointer *)0x0;
      pSVar12 = (SegmentReader *)0x0;
    }
    else {
      pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
      pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
      pSVar12 = local_450;
      iVar5 = local_428;
    }
    uVar15 = (uint)pSVar12;
    uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 7) ||
        (iVar4 = bcmp(RVar14.super_StringPtr.content.ptr,"garply",6), iVar4 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement((StructReader *)&local_450,(ListReader *)this_00,3);
      local_460.parser._0_4_ = 3;
      local_460.super_Schema = SVar1.super_Schema.raw;
      if (local_42c == 0) {
        local_428 = 0x7fffffff;
        pCVar10 = (CapTableReader *)0x0;
        pWVar11 = (WirePointer *)0x0;
        pSVar12 = (SegmentReader *)0x0;
      }
      else {
        pWVar11 = (WirePointer *)CONCAT44(uStack_434,local_438);
        pCVar10 = (CapTableReader *)CONCAT44(uStack_444,local_448);
        pSVar12 = local_450;
      }
      uVar15 = (uint)pSVar12;
      uVar16 = (undefined4)((ulong)pSVar12 >> 0x20);
      RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      in_stack_fffffffffffffc00 = (uint)RVar14.super_StringPtr.content.ptr;
      in_stack_fffffffffffffc04 = RVar14.super_StringPtr.content._4_12_;
      kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x70,ERROR,
                 "\"failed: expected \" \"(\\\"garply\\\") == (barFields[3].getProto().getName())\", \"garply\", barFields[3].getProto().getName()"
                 ,(char (*) [67])
                  "failed: expected (\"garply\") == (barFields[3].getProto().getName())",
                 (char (*) [7])0x504f8d,(Reader *)&stack0xfffffffffffffc00);
      iVar5 = local_428;
    }
    SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_218,(ListReader *)this_00,3);
    local_228 = SVar1.super_Schema.raw;
    uStack_220 = 3;
    field_05.parent.super_Schema.raw._4_4_ = uVar16;
    field_05.parent.super_Schema.raw._0_4_ = uVar15;
    field_05._8_8_ = pCVar10;
    field_05.proto._reader.segment = (SegmentReader *)pWVar11;
    field_05.proto._reader.capTable._0_4_ = iVar5;
    field_05.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
    field_05.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field_05.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field_05.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field_05.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    uVar7 = getFieldTypeFileId(field_05);
    if ((uVar7 != 0x856789abcdef1234) && (kj::_::Debug::minSeverity < 3)) {
      local_460.super_Schema.raw = (RawBrandedSchema *)0x856789abcdef1234;
      SVar1.super_Schema.raw = local_380.parent.super_Schema.raw;
      capnp::_::ListReader::getStructElement(&local_258,(ListReader *)this_00,3);
      local_268 = SVar1.super_Schema.raw;
      uStack_260 = 3;
      field_06.parent.super_Schema.raw._4_4_ = uVar16;
      field_06.parent.super_Schema.raw._0_4_ = uVar15;
      field_06._8_8_ = pCVar10;
      field_06.proto._reader.segment = (SegmentReader *)pWVar11;
      field_06.proto._reader.capTable._0_4_ = iVar5;
      field_06.proto._reader.capTable._4_4_ = in_stack_fffffffffffffbfc;
      field_06.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
      field_06.proto._reader._20_12_ = in_stack_fffffffffffffc04;
      field_06.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
      field_06.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
      getFieldTypeFileId(field_06);
      kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x71,ERROR,
                 "\"failed: expected \" \"(0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))\", 0x856789abcdef1234ull, getFieldTypeFileId(barFields[3])"
                 ,(char (*) [79])
                  "failed: expected (0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))",
                 (unsigned_long_long *)&local_460,(unsigned_long *)&stack0xfffffffffffffbe0);
    }
    uStack_2e0 = 3;
    importPath_01.size_ = 3;
    importPath_01.ptr = &local_68;
    diskPath_00.content.size_ = 0x12;
    diskPath_00.content.ptr = "src/foo/baz.capnp";
    displayName_00.content.size_ = 0x20;
    displayName_00.content.ptr = "not/used/because/already/loaded";
    local_2e8 = &local_68;
    SchemaParser::parseDiskFile(&local_398,displayName_00,diskPath_00,importPath_01);
    Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc00);
    bVar13 = true;
    if (0x3f < local_440) {
      bVar13 = *(long *)&local_450->arena != -0x7dcba9876543210f;
    }
    if ((bVar13) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc00);
      if (local_440 < 0x40) {
        local_3c8.ptr = (char *)0x0;
      }
      else {
        local_3c8.ptr = *(char **)&local_450->arena;
      }
      kj::_::Debug::log<char_const(&)[75],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(0x823456789abcdef1ull) == (bazSchema.getProto().getId())\", 0x823456789abcdef1ull, bazSchema.getProto().getId()"
                 ,(char (*) [75])
                  "failed: expected (0x823456789abcdef1ull) == (bazSchema.getProto().getId())",
                 (unsigned_long_long *)&stack0xfffffffffffffbe0,(unsigned_long *)&local_3c8);
    }
    Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc00);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 0xf) ||
        (iVar5 = bcmp(RVar14.super_StringPtr.content.ptr,"foo2/baz.capnp",0xe), iVar5 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc00);
      local_3c8 = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[79],char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x77,ERROR,
                 "\"failed: expected \" \"(\\\"foo2/baz.capnp\\\") == (bazSchema.getProto().getDisplayName())\", \"foo2/baz.capnp\", bazSchema.getProto().getDisplayName()"
                 ,(char (*) [79])
                  "failed: expected (\"foo2/baz.capnp\") == (bazSchema.getProto().getDisplayName())"
                 ,(char (*) [15])"foo2/baz.capnp",(Reader *)&local_3c8);
    }
    nestedName_00.content.size_ = 4;
    nestedName_00.content.ptr = "Baz";
    local_460 = ParsedSchema::getNested((ParsedSchema *)&stack0xfffffffffffffc00,nestedName_00);
    local_3e0.raw = (RawBrandedSchema *)Schema::asStruct(&local_460.super_Schema);
    Schema::getProto((Reader *)&local_460,&local_3e0);
    if (local_440 < 0x40) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(uint64_t *)&local_450->arena;
    }
    SVar8 = Schema::getDependency(&local_3b8.super_Schema,uVar7,0);
    if ((local_3e0.raw != SVar8.raw) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,&local_3e0);
      if (local_440 < 0x40) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint64_t *)&local_450->arena;
      }
      Schema::getDependency(&local_3b8.super_Schema,uVar7,0);
      kj::_::Debug::log<char_const(&)[88],capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x79,ERROR,
                 "\"failed: expected \" \"(bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))\", bazStruct, barStruct.getDependency(bazStruct.getProto().getId())"
                 ,(char (*) [88])
                  "failed: expected (bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))"
                 ,(StructSchema *)&local_3e0,(Schema *)&stack0xfffffffffffffbe0);
    }
    uStack_2f0 = 3;
    importPath_02.size_ = 3;
    importPath_02.ptr = &local_68;
    diskPath_01.content.size_ = 0x14;
    diskPath_01.content.ptr = "src/qux/corge.capnp";
    displayName_01.content.size_ = 0x20;
    displayName_01.content.ptr = "not/used/because/already/loaded";
    local_2f8 = &local_68;
    local_3c8 = (ArrayPtr<const_char>)
                SchemaParser::parseDiskFile(&local_398,displayName_01,diskPath_01,importPath_02);
    Schema::getProto((Reader *)&local_460,(Schema *)&local_3c8);
    bVar13 = true;
    if (0x3f < local_440) {
      bVar13 = *(long *)&local_450->arena != -0x7cba9876543210ee;
    }
    if ((bVar13) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&local_3c8);
      if (local_440 < 0x40) {
        local_3d8.ptr = (char *)0x0;
      }
      else {
        local_3d8.ptr = *(char **)&local_450->arena;
      }
      kj::_::Debug::log<char_const(&)[77],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x7e,ERROR,
                 "\"failed: expected \" \"(0x83456789abcdef12ull) == (corgeSchema.getProto().getId())\", 0x83456789abcdef12ull, corgeSchema.getProto().getId()"
                 ,(char (*) [77])
                  "failed: expected (0x83456789abcdef12ull) == (corgeSchema.getProto().getId())",
                 (unsigned_long_long *)&stack0xfffffffffffffbe0,(unsigned_long *)&local_3d8);
    }
    Schema::getProto((Reader *)&local_460,(Schema *)&local_3c8);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 0x10) ||
        (iVar5 = bcmp(RVar14.super_StringPtr.content.ptr,"qux/corge.capnp",0xf), iVar5 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&local_3c8);
      local_3d8 = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[82],char_const(&)[16],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x7f,ERROR,
                 "\"failed: expected \" \"(\\\"qux/corge.capnp\\\") == (corgeSchema.getProto().getDisplayName())\", \"qux/corge.capnp\", corgeSchema.getProto().getDisplayName()"
                 ,(char (*) [82])
                  "failed: expected (\"qux/corge.capnp\") == (corgeSchema.getProto().getDisplayName())"
                 ,(char (*) [16])0x4dde06,(Reader *)&local_3d8);
    }
    nestedName_01.content.size_ = 6;
    nestedName_01.content.ptr = "Corge";
    local_460 = ParsedSchema::getNested((ParsedSchema *)&local_3c8,nestedName_01);
    SVar8.raw = (RawBrandedSchema *)Schema::asStruct(&local_460.super_Schema);
    Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc18);
    if (local_440 < 0x40) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(uint64_t *)&local_450->arena;
    }
    SVar9 = Schema::getDependency(&local_3b8.super_Schema,uVar7,0);
    if ((SVar8.raw != SVar9.raw) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc18);
      if (local_440 < 0x40) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint64_t *)&local_450->arena;
      }
      Schema::getDependency(&local_3b8.super_Schema,uVar7,0);
      kj::_::Debug::log<char_const(&)[92],capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x81,ERROR,
                 "\"failed: expected \" \"(corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))\", corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId())"
                 ,(char (*) [92])
                  "failed: expected (corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))"
                 ,(StructSchema *)&stack0xfffffffffffffc18,(Schema *)&stack0xfffffffffffffbe0);
    }
    uStack_300 = 3;
    importPath_03.size_ = 3;
    importPath_03.ptr = &local_68;
    diskPath_02.content.size_ = 0x1a;
    diskPath_02.content.ptr = "/usr/include/grault.capnp";
    displayName_02.content.size_ = 0x20;
    displayName_02.content.ptr = "not/used/because/already/loaded";
    local_308 = &local_68;
    local_3d8 = (ArrayPtr<const_char>)
                SchemaParser::parseDiskFile(&local_398,displayName_02,diskPath_02,importPath_03);
    Schema::getProto((Reader *)&local_460,(Schema *)&local_3d8);
    bVar13 = true;
    if (0x3f < local_440) {
      bVar13 = *(long *)&local_450->arena != -0x7ba9876543210edd;
    }
    if ((bVar13) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&local_3d8);
      if (local_440 < 0x40) {
        local_3a8.ptr = (char *)0x0;
      }
      else {
        local_3a8.ptr = *(char **)&local_450->arena;
      }
      kj::_::Debug::log<char_const(&)[78],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x86,ERROR,
                 "\"failed: expected \" \"(0x8456789abcdef123ull) == (graultSchema.getProto().getId())\", 0x8456789abcdef123ull, graultSchema.getProto().getId()"
                 ,(char (*) [78])
                  "failed: expected (0x8456789abcdef123ull) == (graultSchema.getProto().getId())",
                 (unsigned_long_long *)&stack0xfffffffffffffbe0,(unsigned_long *)&local_3a8);
    }
    Schema::getProto((Reader *)&local_460,(Schema *)&local_3d8);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 0xd) ||
        (iVar5 = bcmp(RVar14.super_StringPtr.content.ptr,"grault.capnp",0xc), iVar5 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&local_3d8);
      local_3a8 = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[80],char_const(&)[13],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x87,ERROR,
                 "\"failed: expected \" \"(\\\"grault.capnp\\\") == (graultSchema.getProto().getDisplayName())\", \"grault.capnp\", graultSchema.getProto().getDisplayName()"
                 ,(char (*) [80])
                  "failed: expected (\"grault.capnp\") == (graultSchema.getProto().getDisplayName())"
                 ,(char (*) [13])0x4dde49,(Reader *)&local_3a8);
    }
    nestedName_02.content.size_ = 7;
    nestedName_02.content.ptr = "Grault";
    local_460 = ParsedSchema::getNested((ParsedSchema *)&local_3d8,nestedName_02);
    SVar8.raw = (RawBrandedSchema *)Schema::asStruct(&local_460.super_Schema);
    Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc10);
    if (local_440 < 0x40) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(uint64_t *)&local_450->arena;
    }
    SVar9 = Schema::getDependency(&local_3b8.super_Schema,uVar7,0);
    if ((SVar8.raw != SVar9.raw) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&stack0xfffffffffffffc10);
      if (local_440 < 0x40) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(uint64_t *)&local_450->arena;
      }
      Schema::getDependency(&local_3b8.super_Schema,uVar7,0);
      kj::_::Debug::log<char_const(&)[94],capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x89,ERROR,
                 "\"failed: expected \" \"(graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))\", graultStruct, barStruct.getDependency(graultStruct.getProto().getId())"
                 ,(char (*) [94])
                  "failed: expected (graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))"
                 ,(StructSchema *)&stack0xfffffffffffffc10,(Schema *)&stack0xfffffffffffffbe0);
    }
    uStack_310 = 3;
    importPath_04.size_ = 3;
    importPath_04.ptr = &local_68;
    diskPath_03.content.size_ = 0x1a;
    diskPath_03.content.ptr = "/opt/include/grault.capnp";
    displayName_03.content.size_ = 0x19;
    displayName_03.content.ptr = "weird/display/name.capnp";
    local_318 = &local_68;
    local_3a8 = (ArrayPtr<const_char>)
                SchemaParser::parseDiskFile(&local_398,displayName_03,diskPath_03,importPath_04);
    Schema::getProto((Reader *)&local_460,(Schema *)&local_3a8);
    bVar13 = true;
    if (0x3f < local_440) {
      bVar13 = *(long *)&local_450->arena != -0x7fffffffffffffff;
    }
    if ((bVar13) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&local_3a8);
      if (local_440 < 0x40) {
        local_288.ptr = (char *)0x0;
      }
      else {
        local_288.ptr = *(char **)&local_450->arena;
      }
      kj::_::Debug::log<char_const(&)[83],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"(0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())\", 0x8000000000000001ull, wrongGraultSchema.getProto().getId()"
                 ,(char (*) [83])
                  "failed: expected (0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())"
                 ,(unsigned_long_long *)&stack0xfffffffffffffbe0,(unsigned_long *)&local_288);
    }
    Schema::getProto((Reader *)&local_460,(Schema *)&local_3a8);
    RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
    if (((RVar14.super_StringPtr.content.size_ != 0x19) ||
        (iVar5 = bcmp(RVar14.super_StringPtr.content.ptr,"weird/display/name.capnp",0x18),
        iVar5 != 0)) && (kj::_::Debug::minSeverity < 3)) {
      Schema::getProto((Reader *)&local_460,(Schema *)&local_3a8);
      local_288 = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)&stack0xfffffffffffffbe0,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[97],char_const(&)[25],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"(\\\"weird/display/name.capnp\\\") == (wrongGraultSchema.getProto().getDisplayName())\", \"weird/display/name.capnp\", wrongGraultSchema.getProto().getDisplayName()"
                 ,(char (*) [97])
                  "failed: expected (\"weird/display/name.capnp\") == (wrongGraultSchema.getProto().getDisplayName())"
                 ,(char (*) [25])"weird/display/name.capnp",(Reader *)&local_288);
    }
    SchemaParser::~SchemaParser(&local_398);
    FakeFileReader::~FakeFileReader(&local_2c8);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&local_460,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
             ,0x69,FAILED,"(4u) == (barFields.size())","4u, barFields.size()",
             (uint *)&stack0xfffffffffffffbe0,(uint *)&stack0xfffffffffffffc00);
  kj::_::Debug::Fault::fatal((Fault *)&local_460);
}

Assistant:

TEST(SchemaParser, Basic) {
  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("src/foo/bar.capnp",
      "@0x8123456789abcdef;\n"
      "struct Bar {\n"
      "  baz @0: import \"baz.capnp\".Baz;\n"
      "  corge @1: import \"../qux/corge.capnp\".Corge;\n"
      "  grault @2: import \"/grault.capnp\".Grault;\n"
      "  garply @3: import \"/garply.capnp\".Garply;\n"
      "}\n");
  reader.add("src/foo/baz.capnp",
      "@0x823456789abcdef1;\n"
      "struct Baz {}\n");
  reader.add("src/qux/corge.capnp",
      "@0x83456789abcdef12;\n"
      "struct Corge {}\n");
  reader.add(ABS("usr/include/grault.capnp"),
      "@0x8456789abcdef123;\n"
      "struct Grault {}\n");
  reader.add(ABS("opt/include/grault.capnp"),
      "@0x8000000000000001;\n"
      "struct WrongGrault {}\n");
  reader.add(ABS("usr/local/include/garply.capnp"),
      "@0x856789abcdef1234;\n"
      "struct Garply {}\n");

  kj::StringPtr importPath[] = {
    ABS("usr/include"), ABS("usr/local/include"), ABS("opt/include")
  };

  ParsedSchema barSchema = parser.parseDiskFile(
      "foo2/bar2.capnp", "src/foo/bar.capnp", importPath);

  auto barProto = barSchema.getProto();
  EXPECT_EQ(0x8123456789abcdefull, barProto.getId());
  EXPECT_EQ("foo2/bar2.capnp", barProto.getDisplayName());

  auto barStruct = barSchema.getNested("Bar");
  auto barFields = barStruct.asStruct().getFields();
  ASSERT_EQ(4u, barFields.size());
  EXPECT_EQ("baz", barFields[0].getProto().getName());
  EXPECT_EQ(0x823456789abcdef1ull, getFieldTypeFileId(barFields[0]));
  EXPECT_EQ("corge", barFields[1].getProto().getName());
  EXPECT_EQ(0x83456789abcdef12ull, getFieldTypeFileId(barFields[1]));
  EXPECT_EQ("grault", barFields[2].getProto().getName());
  EXPECT_EQ(0x8456789abcdef123ull, getFieldTypeFileId(barFields[2]));
  EXPECT_EQ("garply", barFields[3].getProto().getName());
  EXPECT_EQ(0x856789abcdef1234ull, getFieldTypeFileId(barFields[3]));

  auto bazSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/foo/baz.capnp", importPath);
  EXPECT_EQ(0x823456789abcdef1ull, bazSchema.getProto().getId());
  EXPECT_EQ("foo2/baz.capnp", bazSchema.getProto().getDisplayName());
  auto bazStruct = bazSchema.getNested("Baz").asStruct();
  EXPECT_EQ(bazStruct, barStruct.getDependency(bazStruct.getProto().getId()));

  auto corgeSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/qux/corge.capnp", importPath);
  EXPECT_EQ(0x83456789abcdef12ull, corgeSchema.getProto().getId());
  EXPECT_EQ("qux/corge.capnp", corgeSchema.getProto().getDisplayName());
  auto corgeStruct = corgeSchema.getNested("Corge").asStruct();
  EXPECT_EQ(corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId()));

  auto graultSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      ABS("usr/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8456789abcdef123ull, graultSchema.getProto().getId());
  EXPECT_EQ("grault.capnp", graultSchema.getProto().getDisplayName());
  auto graultStruct = graultSchema.getNested("Grault").asStruct();
  EXPECT_EQ(graultStruct, barStruct.getDependency(graultStruct.getProto().getId()));

  // Try importing the other grault.capnp directly.  It'll get the display name we specify since
  // it wasn't imported before.
  auto wrongGraultSchema = parser.parseDiskFile(
      "weird/display/name.capnp",
      ABS("opt/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8000000000000001ull, wrongGraultSchema.getProto().getId());
  EXPECT_EQ("weird/display/name.capnp", wrongGraultSchema.getProto().getDisplayName());
}